

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexWriter.cpp
# Opt level: O3

void __thiscall
Ptex::v2_2::PtexWriterBase::writeFaceBlock
          (PtexWriterBase *this,FILE *fp,void *data,int stride,Res res,FaceDataHeader *fdh)

{
  int iVar1;
  DataType dt;
  FILE *fp_00;
  int vw;
  uint uVar2;
  undefined1 *dst;
  int uw;
  uint uVar3;
  FaceDataHeader **ppFVar4;
  int size;
  ulong uVar5;
  FaceDataHeader *local_48;
  FILE *local_40;
  int local_38;
  int local_34;
  
  ppFVar4 = &local_48;
  local_48 = fdh;
  local_40 = fp;
  uw = 1 << (res.ulog2 & 0x1fU);
  local_38 = 1 << (res.vlog2 & 0x1fU);
  uVar5 = (long)(uw << (res.vlog2 & 0x1fU)) * (long)this->_pixelSize;
  size = (int)uVar5;
  if (size < 0x4001) {
    ppFVar4 = (FaceDataHeader **)((long)&local_48 - (uVar5 + 0xf & 0xfffffffffffffff0));
    dst = (undefined1 *)ppFVar4;
  }
  else {
    local_34 = stride;
    dst = (undefined1 *)operator_new__(uVar5 & 0xffffffff);
    stride = local_34;
  }
  vw = local_38;
  uVar5 = (ulong)(this->_header).datatype;
  iVar1 = *(int *)(DataSize(Ptex::v2_2::DataType)::sizes + uVar5 * 4);
  *(ulong *)((long)ppFVar4 + -8) = (ulong)(this->_header).nchannels;
  *(ulong *)((long)ppFVar4 + -0x10) = uVar5;
  *(undefined8 *)((long)ppFVar4 + -0x18) = 0x1192af;
  PtexUtils::deinterleave
            (data,stride,uw,vw,dst,iVar1 << (res.ulog2 & 0x1fU),*(DataType *)((long)ppFVar4 + -0x10)
             ,*(int *)((long)ppFVar4 + -8));
  dt = (this->_header).datatype;
  uVar3 = 0x40000000;
  if (dt < dt_half) {
    *(undefined8 *)((long)ppFVar4 + -8) = 0x1192cf;
    PtexUtils::encodeDifference(dst,size,dt);
    uVar3 = 0x80000000;
  }
  fp_00 = local_40;
  *(undefined8 *)((long)ppFVar4 + -8) = 0x1192ec;
  uVar2 = writeZipBlock(this,fp_00,dst,size,true);
  local_48->data = uVar2 & 0x3fffffff | uVar3;
  if (0x4000 < size) {
    *(undefined8 *)((long)ppFVar4 + -8) = 0x11930a;
    operator_delete__(dst);
  }
  return;
}

Assistant:

void PtexWriterBase::writeFaceBlock(FILE* fp, const void* data, int stride,
                                    Res res, FaceDataHeader& fdh)
{
    // write a single face data block
    // copy to temp buffer, and deinterleave
    int ures = res.u(), vres = res.v();
    int blockSize = ures*vres*_pixelSize;
    bool useNew = blockSize > AllocaMax;
    char* buff = useNew ? new char [blockSize] : (char*)alloca(blockSize);
    PtexUtils::deinterleave(data, stride, ures, vres, buff,
                            ures*DataSize(datatype()),
                            datatype(), _header.nchannels);

    // difference if needed
    bool diff = (datatype() == dt_uint8 ||
                 datatype() == dt_uint16);
    if (diff) PtexUtils::encodeDifference(buff, blockSize, datatype());

    // compress and stream data to file, and record size in header
    int zippedsize = writeZipBlock(fp, buff, blockSize);

    // record compressed size and encoding in data header
    fdh.set(zippedsize, diff ? enc_diffzipped : enc_zipped);
    if (useNew) delete [] buff;
}